

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O1

int convolve(char *type,char *method,double *inp1,int N,double *inp2,int L,double *oup)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *oup_00;
  conv_object obj;
  int iVar4;
  int iVar5;
  char *__s;
  
  iVar4 = N + L + -1;
  iVar1 = L;
  if (L < N) {
    iVar1 = N;
  }
  iVar2 = L;
  if (N < L) {
    iVar2 = N;
  }
  oup_00 = (double *)malloc((long)iVar4 << 3);
  iVar3 = strcmp(method,"direct");
  if ((method == (char *)0x0) || (iVar3 == 0)) {
    conv_direct(inp1,N,inp2,L,oup_00);
  }
  else {
    iVar3 = strcmp(method,"fft");
    if (iVar3 != 0) {
      __s = "method - \'direct\' or \'fft\' ";
      goto LAB_0013ac72;
    }
    obj = conv_init(N,L);
    conv_fft(obj,inp1,inp2,oup_00);
    free_conv(obj);
  }
  iVar3 = strcmp(type,"full");
  iVar5 = 0;
  if ((type != (char *)0x0) && (iVar3 != 0)) {
    iVar3 = strcmp(type,"same");
    if (iVar3 == 0) {
      iVar5 = (iVar4 - iVar1) / 2;
      iVar4 = iVar1;
    }
    else {
      iVar4 = strcmp(type,"valid");
      if (iVar4 != 0) {
        __s = "type - One of \'full\', \'same\' or \'valid\' ";
LAB_0013ac72:
        puts(__s);
        exit(-1);
      }
      iVar5 = iVar2 + -1;
      iVar4 = iVar1;
      if (iVar2 != 0) {
        iVar4 = (iVar1 - iVar2) + 1;
      }
    }
  }
  memcpy(oup,oup_00 + iVar5,(long)iVar4 * 8);
  free(oup_00);
  return iVar4;
}

Assistant:

int convolve(const char *type, const char *method, fft_type *inp1, int N, fft_type *inp2, int L, fft_type *oup) {
	/*

	method - 'direct' or 'fft'
	type - One of 'full', 'same' or 'valid'
	inp1 - First vector of length N
	inp2 - Second vector of length L
	oup2 - Output vector of :

	length N+L-1, if type is 'full'
	length max(N,L), if type is 'same'
	length max(N,L), - min(N,L) + 1 if type is valid

	*/
	int M, LB, LS, start, pad, i;
	fft_type *oup2;
	conv_object conv;

	M = N + L - 1;

	LB = N >= L ? N : L;
	LS = LB == N ? L : N;

	oup2 = (fft_type*)malloc(sizeof(fft_type)*M);

	pad = 0;

	if (!strcmp(method, "direct") || method == NULL) {

		conv_direct(inp1, N, inp2, L, oup2);

	}
	else if (!strcmp(method, "fft")) {

		conv = conv_init(N, L);

		conv_fft(conv, inp1, inp2, oup2);

		free_conv(conv);
	}
	else {
		printf("method - 'direct' or 'fft' \n");
		exit(-1);
	}


	if (!strcmp(type, "full") || type == NULL) {

		start = 0;

		pad = M;

	}
	else  if (!strcmp(type, "same")) {

		start = (M - LB) / 2;

		pad = LB;

	}
	else  if (!strcmp(type, "valid")) {

		start = LS - 1;

		if (LS == 0) {
			pad = LB;
		}
		else {
			pad = LB - LS + 1;
		}

	}
	else {
		printf("type - One of 'full', 'same' or 'valid' \n");
		exit(-1);
	}

	memcpy(oup, oup2 + start, sizeof(fft_type) * pad);


	free(oup2);

	return pad;
}